

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_add_http2_header_status(lws *wsi,uint code,uchar **p,uchar *end)

{
  int iVar1;
  uchar local_3a [2];
  int n;
  uchar status [10];
  uchar *end_local;
  uchar **p_local;
  uint code_local;
  lws *wsi_local;
  
  (wsi->h2).field_0x11 = (wsi->h2).field_0x11 & 0xfb;
  status._2_8_ = end;
  iVar1 = sprintf((char *)local_3a,"%u",(ulong)code);
  iVar1 = lws_add_http2_header_by_token
                    (wsi,WSI_TOKEN_HTTP_COLON_STATUS,local_3a,iVar1,p,(uchar *)status._2_8_);
  wsi_local._4_4_ = (uint)(iVar1 != 0);
  return wsi_local._4_4_;
}

Assistant:

int lws_add_http2_header_status(struct lws *wsi, unsigned int code,
				unsigned char **p, unsigned char *end)
{
	unsigned char status[10];
	int n;

	wsi->h2.send_END_STREAM = 0; // !!(code >= 400);

	n = sprintf((char *)status, "%u", code);
	if (lws_add_http2_header_by_token(wsi, WSI_TOKEN_HTTP_COLON_STATUS,
					  status, n, p, end))

		return 1;

	return 0;
}